

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O3

void test_ADynArray_appendADynArray_success_nullptrSrcArray_fn(int _i)

{
  int iVar1;
  char *__s2;
  void *_ck_x;
  
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  __s2 = (char *)private_ACUtilsTest_ADynArray_realloc((void *)0x0,5);
  builtin_strncpy(__s2,"0123",5);
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
              ,0x5e3);
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
              ,0x5e4);
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
              ,0x5e5);
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
              ,0x5e6);
  iVar1 = strcmp("0123",__s2);
  if (iVar1 != 0) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x5e7,
                      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                      ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                      "destArray.buffer == \"0123\"","destArray.buffer","\"",__s2,"\"","\"0123\"",
                      "\"","0123","\"",0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
              ,0x5e7);
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
              ,0x5e8);
  if (private_ACUtilsTest_ADynArray_reallocCount == 0) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x5e9);
    private_ACUtilsTest_ADynArray_freeCount = private_ACUtilsTest_ADynArray_freeCount + 1;
    free(__s2);
    return;
  }
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x5e9,"Assertion \'_ck_x == _ck_y\' failed",
                    "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                    "private_ACUtilsTest_ADynArray_reallocCount == 0",
                    "private_ACUtilsTest_ADynArray_reallocCount",
                    private_ACUtilsTest_ADynArray_reallocCount,"0",0,0);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_appendADynArray_success_nullptrSrcArray)
{
    struct private_ACUtilsTest_ADynArray_CharArray destArray = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    struct private_ACUtilsTest_ADynArray_CharArray *srcArray = nullptr;
    destArray.size = 5;
    destArray.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    destArray.capacity = 5;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    destArray.buffer = (char*) destArray.reallocator(nullptr, destArray.capacity);
    memcpy(destArray.buffer, "0123", 5);
    private_ACUtilsTest_ADynArray_reallocCount = 0;
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_appendADynArray(&destArray, srcArray), true);
    ACUTILSTEST_ASSERT_UINT_EQ(destArray.size, 5);
    ACUTILSTEST_ASSERT_UINT_EQ(destArray.capacity, 5);
    ACUTILSTEST_ASSERT_PTR_NONNULL(destArray.buffer);
    ACUTILSTEST_ASSERT_STR_EQ(destArray.buffer, "0123");
    ACUTILSTEST_ASSERT_PTR_NONNULL(destArray.growStrategy);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 0);
    destArray.deallocator(destArray.buffer);
}